

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

void WebPUtilClearPic(WebPPicture *picture,FrameRectangle *rect)

{
  int *in_RSI;
  WebPPicture *in_RDI;
  
  if (in_RSI == (int *)0x0) {
    ClearRectangle(in_RDI,0,0,in_RDI->width,in_RDI->height);
  }
  else {
    ClearRectangle(in_RDI,*in_RSI,in_RSI[1],in_RSI[2],in_RSI[3]);
  }
  return;
}

Assistant:

static void WebPUtilClearPic(WebPPicture* const picture,
                             const FrameRectangle* const rect) {
  if (rect != NULL) {
    ClearRectangle(picture, rect->x_offset_, rect->y_offset_,
                   rect->width_, rect->height_);
  } else {
    ClearRectangle(picture, 0, 0, picture->width, picture->height);
  }
}